

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceLayoutAboutToBeChanged
          (QSortFilterProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QList<QPersistentModelIndex> *this_00;
  QObject *this_01;
  bool bVar1;
  QPersistentModelIndex *this_02;
  QModelIndex *this_03;
  long lVar2;
  long in_FS_OFFSET;
  QModelIndex local_70;
  Data *local_58;
  pair<QModelIndex,_QPersistentModelIndex> *ppStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::clear(&this->saved_persistent_indexes);
  this_00 = &this->saved_layoutChange_parents;
  QList<QPersistentModelIndex>::clear(this_00);
  this_02 = (sourceParents->d).ptr;
  lVar2 = (sourceParents->d).size << 3;
  do {
    if (lVar2 == 0) {
      if (((sourceParents->d).size == 0) || ((this->saved_layoutChange_parents).d.size != 0)) {
        QAbstractItemModel::layoutAboutToBeChanged
                  ((QAbstractItemModel *)this_01,this_00,NoLayoutChangeHint);
        if ((this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.persistent.
            indexes.m_size != 0) {
          store_persistent_indexes((QModelIndexPairList *)&local_58,this);
          QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator=
                    (&(this->saved_persistent_indexes).d,
                     (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)&local_58)
          ;
          QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QArrayDataPointer
                    ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)&local_58)
          ;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    bVar1 = QPersistentModelIndex::isValid(this_02);
    if (bVar1) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      ppStack_50 = (pair<QModelIndex,_QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(this_02);
      (*this_01->_vptr_QObject[0x33])((QModelIndex *)&local_58,this_01,&local_70);
      if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
         (local_48.ptr != (QAbstractItemModel *)0x0)) {
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_70,(QModelIndex *)&local_58);
        QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                  (this_00,(QPersistentModelIndex *)&local_70);
        this_03 = &local_70;
        goto LAB_0041c301;
      }
    }
    else {
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58);
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                (this_00,(QPersistentModelIndex *)&local_58);
      this_03 = (QModelIndex *)&local_58;
LAB_0041c301:
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_03);
    }
    this_02 = this_02 + 1;
    lVar2 = lVar2 + -8;
  } while( true );
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceLayoutAboutToBeChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QSortFilterProxyModel);
    Q_UNUSED(hint); // We can't forward Hint because we might filter additional rows or columns
    saved_persistent_indexes.clear();

    saved_layoutChange_parents.clear();
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            saved_layoutChange_parents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        // Might be filtered out.
        if (mappedParent.isValid())
            saved_layoutChange_parents << mappedParent;
    }

    // All parents filtered out.
    if (!sourceParents.isEmpty() && saved_layoutChange_parents.isEmpty())
        return;

    emit q->layoutAboutToBeChanged(saved_layoutChange_parents);
    if (persistent.indexes.isEmpty())
        return;

    saved_persistent_indexes = store_persistent_indexes();
}